

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

Error __thiscall wave::File::Impl::ReadHeader(Impl *this,HeaderList *headers)

{
  FMTHeader *output;
  DataHeader *output_00;
  char cVar1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  Error EVar5;
  string local_110;
  Header data_header;
  Header local_c0;
  Header local_90;
  Header local_60;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    EVar5 = kNotOpen;
  }
  else {
    std::istream::seekg((long)this,_S_beg);
    uVar3 = std::istream::tellg();
    if (uVar3 < 0x2c) {
      EVar5 = kInvalidFormat;
    }
    else {
      std::istream::seekg((long)this,_S_beg);
      HeaderList::riff(&local_60,headers);
      ReadHeader<wave::RIFFHeader>(this,&local_60,&(this->header).riff);
      std::__cxx11::string::~string((string *)&local_60);
      HeaderList::fmt(&local_90,headers);
      output = &(this->header).fmt;
      ReadHeader<wave::FMTHeader>(this,&local_90,output);
      std::__cxx11::string::~string((string *)&local_90);
      HeaderList::data(&local_c0,headers);
      output_00 = &(this->header).data;
      ReadHeader<wave::DataHeader>(this,&local_c0,output_00);
      std::__cxx11::string::~string((string *)&local_c0);
      HeaderList::data(&data_header,headers);
      uVar4 = Header::position(&data_header);
      Header::chunk_id_abi_cxx11_(&local_110,&data_header);
      this->data_offset_ = local_110._M_string_length + uVar4 + 4;
      std::__cxx11::string::~string((string *)&local_110);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,&this->header,&(this->header).riff.chunk_size);
      bVar2 = std::operator!=(&local_110,"RIFF");
      std::__cxx11::string::~string((string *)&local_110);
      EVar5 = kInvalidFormat;
      if (!bVar2) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,(this->header).riff.format,output);
        bVar2 = std::operator!=(&local_110,"WAVE");
        std::__cxx11::string::~string((string *)&local_110);
        if (!bVar2) {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,output,&(this->header).fmt.sub_chunk_1_size);
          bVar2 = std::operator!=(&local_110,"fmt ");
          std::__cxx11::string::~string((string *)&local_110);
          if (!bVar2) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,output_00,&(this->header).data.sub_chunk_2_size);
            bVar2 = std::operator!=(&local_110,"data");
            std::__cxx11::string::~string((string *)&local_110);
            if (((!bVar2) && (uVar3 = (ulong)(this->header).fmt.bits_per_sample, uVar3 < 0x21)) &&
               ((0x100010100U >> (uVar3 & 0x3f) & 1) != 0)) {
              EVar5 = (uint)((this->header).fmt.audio_format != 1) * 3;
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&data_header);
    }
  }
  return EVar5;
}

Assistant:

Error ReadHeader(HeaderList* headers) {
    if (!istream.is_open()) {
      return kNotOpen;
    }
    istream.seekg(0, std::ios::end);
    auto file_size = istream.tellg();
    // If not enough data
    if (file_size < sizeof(WAVEHeader)) {
      return kInvalidFormat;
    }
    istream.seekg(0, std::ios::beg);
    
    // read headers
    ReadHeader(headers->riff(), &header.riff);
    ReadHeader(headers->fmt(), &header.fmt);
    ReadHeader(headers->data(), &header.data);
    // data offset is right after data header's ID and size
    auto data_header = headers->data();
    data_offset_ = data_header.position() + sizeof(data_header.chunk_size()) + (data_header.chunk_id().size() * sizeof(char));

    // check headers ids (make sure they are set)
    if (std::string(header.riff.chunk_id, 4) != "RIFF") {
      return kInvalidFormat;
    }
    if (std::string(header.riff.format, 4) != "WAVE") {
      return kInvalidFormat;
    }
    if (std::string(header.fmt.sub_chunk_1_id, 4) != "fmt ") {
      return kInvalidFormat;
    }
    if (std::string(header.data.sub_chunk_2_id, 4) != "data") {
      return kInvalidFormat;
    }

    // we only support 8 / 16 / 32  bit per sample
    auto bps = header.fmt.bits_per_sample;
    if (bps != 8 && bps != 16 && bps != 32) {
      return kInvalidFormat;
    }
    
    // And only support uncompressed PCM format
    if (header.fmt.audio_format != Format::WAVE_FORMAT_PCM) {
      return kInvalidFormat;
    }
    
    return kNoError;
  }